

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O0

void UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uint8_t uVar1;
  char cVar2;
  UChar UVar3;
  UConverter *pUVar4;
  uint8_t *puVar5;
  void *pvVar6;
  UConverter *pUVar7;
  UChar *pUVar8;
  UChar trail;
  UConverterDataCompoundText *myConverterData;
  int local_68;
  int32_t j;
  int32_t n;
  int32_t i;
  int32_t pValueLength;
  uint32_t pValue;
  COMPOUND_TEXT_CONVERTERS tmpState;
  COMPOUND_TEXT_CONVERTERS currentState;
  int32_t tmpTargetBufferLength;
  uint8_t tmpTargetBuffer [7];
  UBool useFallback;
  UChar32 sourceChar;
  UChar *sourceLimit;
  UChar *source;
  uint8_t *targetLimit;
  uint8_t *target;
  UConverter *cnv;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  pUVar4 = args->converter;
  targetLimit = (uint8_t *)args->target;
  puVar5 = (uint8_t *)args->targetLimit;
  sourceLimit = args->source;
  unique0x00012000 = args->sourceLimit;
  tmpTargetBufferLength._3_1_ = pUVar4->useFallback;
  pvVar6 = pUVar4->extraInfo;
  pValue = *(uint32_t *)((long)pvVar6 + 0xa0);
  tmpTargetBuffer._0_4_ = pUVar4->fromUChar32;
  if (tmpTargetBuffer._0_4_ == 0) goto LAB_0037f63d;
  if (puVar5 <= targetLimit) goto LAB_0037f63d;
  while( true ) {
    if (stack0xffffffffffffffc0 <= sourceLimit) {
      pUVar4->fromUChar32 = tmpTargetBuffer._0_4_;
      goto LAB_0037f9e3;
    }
    if ((*sourceLimit & 0xfc00U) != 0xdc00) break;
    tmpTargetBuffer._0_4_ = tmpTargetBuffer._0_4_ * 0x400 + (uint)(ushort)*sourceLimit + -0x35fdc00;
    pUVar4->fromUChar32 = 0;
    sourceLimit = sourceLimit + 1;
    do {
      tmpState = COMPOUND_TEXT_SINGLE_0;
      pValueLength = getState(tmpTargetBuffer._0_4_);
      if ((pValueLength != DO_SEARCH) && (pValue != pValueLength)) {
        for (j = 0; pValue = pValueLength, escSeqCompoundText[pValueLength][j] != '\0'; j = j + 1) {
          *(uint8_t *)((long)&currentState + (long)tmpState) = escSeqCompoundText[pValueLength][j];
          tmpState = tmpState + COMPOUND_TEXT_SINGLE_1;
        }
      }
      if (pValueLength == DO_SEARCH) {
        j = 1;
LAB_0037f7c1:
        if (j < 0xc) {
          local_68 = ucnv_MBCSFromUChar32_63
                               (*(UConverterSharedData **)((long)pvVar6 + (long)j * 8),
                                tmpTargetBuffer._0_4_,(uint32_t *)&i,tmpTargetBufferLength._3_1_);
          if (local_68 < 1) goto LAB_0037f8a1;
          pValueLength = j;
          if (pValue != j) {
            pValue = j;
            for (myConverterData._4_4_ = 0; escSeqCompoundText[j][myConverterData._4_4_] != '\0';
                myConverterData._4_4_ = myConverterData._4_4_ + 1) {
              *(uint8_t *)((long)&currentState + (long)tmpState) =
                   escSeqCompoundText[j][myConverterData._4_4_];
              tmpState = tmpState + COMPOUND_TEXT_SINGLE_1;
            }
          }
          while (local_68 = local_68 + -1, -1 < local_68) {
            *(char *)((long)&currentState + (long)tmpState) =
                 (char)((uint)i >> ((char)local_68 * '\b' & 0x1fU));
            tmpState = tmpState + COMPOUND_TEXT_SINGLE_1;
          }
        }
        goto LAB_0037f935;
      }
      if (pValueLength == COMPOUND_TEXT_SINGLE_0) {
        *(uint8_t *)((long)&currentState + (long)tmpState) = (uint8_t)tmpTargetBuffer._0_4_;
        tmpState = tmpState + COMPOUND_TEXT_SINGLE_1;
      }
      else {
        local_68 = ucnv_MBCSFromUChar32_63
                             (*(UConverterSharedData **)((long)pvVar6 + (long)(int)pValue * 8),
                              tmpTargetBuffer._0_4_,(uint32_t *)&i,tmpTargetBufferLength._3_1_);
        if (0 < local_68) {
          while (local_68 = local_68 + -1, -1 < local_68) {
            *(char *)((long)&currentState + (long)tmpState) =
                 (char)((uint)i >> ((char)local_68 * '\b' & 0x1fU));
            tmpState = tmpState + COMPOUND_TEXT_SINGLE_1;
          }
        }
      }
LAB_0037f935:
      for (j = 0; j < tmpState; j = j + 1) {
        if (puVar5 <= targetLimit) {
          *err = U_BUFFER_OVERFLOW_ERROR;
          break;
        }
        *targetLimit = *(uint8_t *)((long)&currentState + (long)j);
        targetLimit = targetLimit + 1;
      }
      if (*err == U_BUFFER_OVERFLOW_ERROR) {
        for (; j < tmpState; j = j + 1) {
          uVar1 = *(uint8_t *)((long)&currentState + (long)j);
          pUVar7 = args->converter;
          cVar2 = args->converter->charErrorBufferLength;
          args->converter->charErrorBufferLength = cVar2 + '\x01';
          pUVar7->charErrorBuffer[cVar2] = uVar1;
        }
      }
LAB_0037f63d:
      if (stack0xffffffffffffffc0 <= sourceLimit) goto LAB_0037f9e3;
      if (puVar5 <= targetLimit) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_0037f9e3;
      }
      pUVar8 = sourceLimit + 1;
      UVar3 = *sourceLimit;
      tmpTargetBuffer._0_4_ = ZEXT24((ushort)UVar3);
      sourceLimit = pUVar8;
    } while ((tmpTargetBuffer._0_4_ & 0xfffff800) != 0xd800);
    if ((UVar3 & 0x400U) != 0) {
      *err = U_ILLEGAL_CHAR_FOUND;
      pUVar4->fromUChar32 = tmpTargetBuffer._0_4_;
LAB_0037f9e3:
      *(uint32_t *)((long)pvVar6 + 0xa0) = pValue;
      args->source = sourceLimit;
      args->target = (char *)targetLimit;
      return;
    }
  }
  *err = U_ILLEGAL_CHAR_FOUND;
  pUVar4->fromUChar32 = tmpTargetBuffer._0_4_;
  goto LAB_0037f9e3;
LAB_0037f8a1:
  j = j + 1;
  goto LAB_0037f7c1;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    /* int32_t* offsets = args->offsets; */
    UChar32 sourceChar;
    UBool useFallback = cnv->useFallback;
    uint8_t tmpTargetBuffer[7];
    int32_t tmpTargetBufferLength = 0;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    uint32_t pValue;
    int32_t pValueLength = 0;
    int32_t i, n, j;

    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) cnv->extraInfo;

    currentState = myConverterData->state;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

             tmpTargetBufferLength = 0;
             tmpState = getState(sourceChar);

             if (tmpState != DO_SEARCH && currentState != tmpState) {
                 /* Get escape sequence if necessary */
                 currentState = tmpState;
                 for (i = 0; escSeqCompoundText[currentState][i] != 0; i++) {
                     tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][i];
                 }
             }

             if (tmpState == DO_SEARCH) {
                 /* Test all available converters */
                 for (i = 1; i < SEARCH_LENGTH; i++) {
                     pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[i], sourceChar, &pValue, useFallback);
                     if (pValueLength > 0) {
                         tmpState = (COMPOUND_TEXT_CONVERTERS)i;
                         if (currentState != tmpState) {
                             currentState = tmpState;
                             for (j = 0; escSeqCompoundText[currentState][j] != 0; j++) {
                                 tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][j];
                             }
                         }
                         for (n = (pValueLength - 1); n >= 0; n--) {
                             tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                         }
                         break;
                     }
                 }
             } else if (tmpState == COMPOUND_TEXT_SINGLE_0) {
                 tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)sourceChar;
             } else {
                 pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[currentState], sourceChar, &pValue, useFallback);
                 if (pValueLength > 0) {
                     for (n = (pValueLength - 1); n >= 0; n--) {
                         tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                     }
                 }
             }

             for (i = 0; i < tmpTargetBufferLength; i++) {
                 if (target < targetLimit) {
                     *target++ = tmpTargetBuffer[i];
                 } else {
                     *err = U_BUFFER_OVERFLOW_ERROR;
                     break;
                 }
             }

             if (*err == U_BUFFER_OVERFLOW_ERROR) {
                 for (; i < tmpTargetBufferLength; i++) {
                     args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = tmpTargetBuffer[i];
                 }
             }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*save the state and return */
    myConverterData->state = currentState;
    args->source = source;
    args->target = (char*)target;
}